

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkfd.c
# Opt level: O0

void forkfd_initialize(void)

{
  long in_FS_OFFSET;
  sigaction action;
  _union_1457 local_a8;
  sigset_t sStack_a0;
  undefined8 uStack_20;
  undefined8 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sStack_a0.__val[0xf] = 0;
  uStack_20 = 0;
  sStack_a0.__val[0xd] = 0;
  sStack_a0.__val[0xe] = 0;
  sStack_a0.__val[0xb] = 0;
  sStack_a0.__val[0xc] = 0;
  sStack_a0.__val[9] = 0;
  sStack_a0.__val[10] = 0;
  sStack_a0.__val[7] = 0;
  sStack_a0.__val[8] = 0;
  sStack_a0.__val[5] = 0;
  sStack_a0.__val[6] = 0;
  sStack_a0.__val[3] = 0;
  sStack_a0.__val[4] = 0;
  sStack_a0.__val[1] = 0;
  sStack_a0.__val[2] = 0;
  local_a8.sa_handler = (__sighandler_t)0x0;
  sStack_a0.__val[0] = 0;
  local_18 = 0;
  sigemptyset(&sStack_a0);
  uStack_20 = CONCAT44(uStack_20._4_4_,5);
  local_a8.sa_handler = sigchld_handler;
  sigaction(0x11,(sigaction *)&local_a8,(sigaction *)&old_sigaction);
  ignore_sigpipe();
  forkfd_status = 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void forkfd_initialize()
{
#if defined(HAVE_BROKEN_WAITID)
    pid_t pid = fork();
    if (pid == 0) {
        _exit(0);
    } else if (pid > 0) {
        siginfo_t info;
        waitid(P_ALL, 0, &info, WNOWAIT | WEXITED);
        waitid_works = (info.si_pid != 0);
        info.si_pid = 0;

        // now really reap the child
        waitid(P_PID, pid, &info, WEXITED);
        waitid_works = waitid_works && (info.si_pid != 0);
    }
#endif

    /* install our signal handler */
    struct sigaction action;
    memset(&action, 0, sizeof action);
    sigemptyset(&action.sa_mask);
    action.sa_flags = SA_NOCLDSTOP | SA_SIGINFO;
    action.sa_sigaction = sigchld_handler;

    /* ### RACE CONDITION
     * The sigaction function does a memcpy from an internal buffer
     * to old_sigaction, which we use in the SIGCHLD handler. If a
     * SIGCHLD is delivered before or during that memcpy, the handler will
     * see an inconsistent state.
     *
     * There is no solution. pthread_sigmask doesn't work here because the
     * signal could be delivered to another thread.
     */
    sigaction(SIGCHLD, &action, &old_sigaction);

#ifndef O_NOSIGPIPE
    /* disable SIGPIPE too */
    ignore_sigpipe();
#endif

#ifdef __GNUC__
    (void) cleanup; /* suppress unused static function warning */
#else
    atexit(cleanup);
#endif

    ffd_atomic_store(&forkfd_status, 1, FFD_ATOMIC_RELAXED);
}